

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-stdio-over-pipes.c
# Opt level: O2

int run_test_stdio_over_pipes(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  uv_stdio_container_t stdio [2];
  uv_process_t process;
  
  ::loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_exepath(exepath,&exepath_size);
  if (iVar1 == 0) {
    args[0] = exepath;
    args[1] = "stdio_over_pipes_helper";
    args[2] = (char *)0x0;
    exepath[exepath_size] = '\0';
    options.file = exepath;
    options.args = args;
    options.exit_cb = exit_cb;
    uv_pipe_init(::loop,&out,0);
    uv_pipe_init(::loop,&in,0);
    stdio[0].flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
    stdio[0].data.stream = (uv_stream_t *)&in;
    stdio[1].flags = UV_WRITABLE_PIPE|UV_CREATE_PIPE;
    stdio[1].data.stream = (uv_stream_t *)&out;
    options.stdio_count = 2;
    options.stdio = stdio;
    iVar1 = uv_spawn(::loop,&process,&options);
    if (iVar1 == 0) {
      iVar1 = uv_read_start(&out,on_alloc,on_read);
      if (iVar1 == 0) {
        uVar2 = uv_default_loop();
        iVar1 = uv_run(uVar2,0);
        if (iVar1 == 0) {
          if (on_read_cb_called < 2) {
            pcVar3 = "on_read_cb_called > 1";
            uVar2 = 0x93;
          }
          else if (after_write_cb_called == 1) {
            if (exit_cb_called == 1) {
              if (close_cb_called == 3) {
                iVar1 = bcmp("hello world\n",output,0xc);
                if (iVar1 == 0) {
                  if (output_used == 0xc) {
                    loop = (uv_loop_t *)uv_default_loop();
                    close_loop(loop);
                    uVar2 = uv_default_loop();
                    iVar1 = uv_loop_close(uVar2);
                    if (iVar1 == 0) {
                      return 0;
                    }
                    pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                    uVar2 = 0x9a;
                  }
                  else {
                    pcVar3 = "output_used == 12";
                    uVar2 = 0x98;
                  }
                }
                else {
                  pcVar3 = "memcmp(\"hello world\\n\", output, 12) == 0";
                  uVar2 = 0x97;
                }
              }
              else {
                pcVar3 = "close_cb_called == 3";
                uVar2 = 0x96;
              }
            }
            else {
              pcVar3 = "exit_cb_called == 1";
              uVar2 = 0x95;
            }
          }
          else {
            pcVar3 = "after_write_cb_called == 1";
            uVar2 = 0x94;
          }
        }
        else {
          pcVar3 = "r == 0";
          uVar2 = 0x91;
        }
      }
      else {
        pcVar3 = "r == 0";
        uVar2 = 0x8e;
      }
    }
    else {
      pcVar3 = "r == 0";
      uVar2 = 0x8b;
    }
  }
  else {
    pcVar3 = "r == 0";
    uVar2 = 0x41;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(stdio_over_pipes) {
  int r;
  uv_process_t process;
  uv_stdio_container_t stdio[2];

  loop = uv_default_loop();

  init_process_options("stdio_over_pipes_helper", exit_cb);

  uv_pipe_init(loop, &out, 0);
  uv_pipe_init(loop, &in, 0);

  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*)&in;
  options.stdio[1].flags = UV_CREATE_PIPE | UV_WRITABLE_PIPE;
  options.stdio[1].data.stream = (uv_stream_t*)&out;
  options.stdio_count = 2;

  r = uv_spawn(loop, &process, &options);
  ASSERT(r == 0);

  r = uv_read_start((uv_stream_t*) &out, on_alloc, on_read);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(on_read_cb_called > 1);
  ASSERT(after_write_cb_called == 1);
  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 3);
  ASSERT(memcmp("hello world\n", output, 12) == 0);
  ASSERT(output_used == 12);

  MAKE_VALGRIND_HAPPY();
  return 0;
}